

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2304a::matrix_dot_notmatch_1_Test::TestBody(matrix_dot_notmatch_1_Test *this)

{
  long lVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  allocator_type local_e3;
  allocator_type local_e2;
  allocator_type local_e1;
  axes_type local_e0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  matrix m3;
  matrix m2;
  double local_58 [3];
  matrix m1;
  
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&m2,__l,&local_e2);
  local_58[0] = 3.0;
  local_58[1] = 4.0;
  __l_00._M_len = 2;
  __l_00._M_array = local_58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&m2.super_tensor<double,_2U>._axes_sort,
             __l_00,&local_e3);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&m2;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&m3,__l_01,&local_e1);
  local_e0._M_elems[0] = 2;
  local_e0._M_elems[1] = 2;
  dnet::data_types::matrix::matrix(&m1,(type *)&m3,&local_e0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&m3);
  lVar1 = 0x18;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)&(((tensor<double,_2U> *)(&m2.super_tensor<double,_2U>._axes_sort + -3))->
                       _data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_58[0] = 1.0;
  local_58[1] = 2.0;
  __l_02._M_len = 2;
  __l_02._M_array = local_58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_d8,__l_02,&local_e2);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_d8;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&m3,__l_03,(allocator_type *)&local_e3);
  local_e0._M_elems[0] = 1;
  local_e0._M_elems[1] = 2;
  dnet::data_types::matrix::matrix(&m2,(type *)&m3,&local_e0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&m3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
  dnet::data_types::matrix::dot(&m3,&m1,&m2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&m3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&m2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&m1);
  return;
}

Assistant:

TEST(matrix, dot_notmatch_1)
    {
        matrix m1({{1, 2}, {3, 4}}, {2, 2});
        matrix m2({{1, 2}}, {1, 2});
        try {
            matrix m3 = m1.dot(m2);
        }
        catch (const dnet::misc::exception &e) {
            std::cout << e;
        }
    }